

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::WriteConObjExpressions
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this)

{
  File *f;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ExprArgWriter ew;
  
  f = &this->nm;
  uVar4 = 0;
  while (uVar1 = (ulong)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons
        , (long)uVar4 < (long)uVar1) {
    WriteDefinedVariables(this,(int)(uVar4 + 1));
    BinaryFormatter::apr
              (&this->super_FormatterType,f,"%c%d\t#%s\n",0x43,uVar4 & 0xffffffff,
               this->feeder_->mdl_->con_name[uVar4]);
    ew.nargs_ = 1;
    ew.nlw_ = this;
    ExampleNLFeeder::
    FeedConExpression<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
              (this->feeder_,(int)uVar4,&ew);
    uVar4 = uVar4 + 1;
  }
  while ((long)uVar4 <
         (long)(int)uVar1 +
         (long)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons) {
    iVar2 = (int)(uVar4 + 1);
    WriteDefinedVariables(this,iVar2);
    BinaryFormatter::apr
              (&this->super_FormatterType,f,"%c%d\t#%s\n",0x4c,
               (ulong)(uint)((int)uVar4 -
                            (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                            num_algebraic_cons),this->feeder_->mdl_->con_name[uVar4]);
    ew.nargs_ = 1;
    ew.nlw_ = this;
    ExampleNLFeeder::
    FeedConExpression<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
              (this->feeder_,iVar2 + -1,&ew);
    uVar4 = uVar4 + 1;
    uVar1 = (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                         num_algebraic_cons;
  }
  iVar2 = -1;
  for (uVar3 = 0; (int)uVar3 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs;
      uVar3 = uVar3 + 1) {
    WriteDefinedVariables(this,iVar2);
    BinaryFormatter::apr
              (&this->super_FormatterType,f,"%c%d %d\t#%s\n",0x4f,(ulong)uVar3,
               (ulong)(uint)this->feeder_->mdl_->obj_sense,"Obj_t2t3");
    ew.nargs_ = 1;
    ew.nlw_ = this;
    ExampleModel::
    WriteObjExpr<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
              (this->feeder_->mdl_,&ew);
    iVar2 = iVar2 + -1;
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteConObjExpressions() {
  int i=0;
  for (; i<Hdr().num_algebraic_cons; ++i) {
    WriteDefinedVariables(i+1);              // i+1
    apr(nm, "%c%d\t#%s\n", 'C', i,
        Feeder().ConDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedConExpression(i, ew);
  }
  for (;
       i<Hdr().num_algebraic_cons + Hdr().num_logical_cons;
       ++i) {
    WriteDefinedVariables(i+1);              // i+1
    apr(nm, "%c%d\t#%s\n", 'L',
        i - Hdr().num_algebraic_cons,
        Feeder().ConDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedConExpression(i, ew);
  }
  for (i=0; i<Hdr().num_objs; ++i) {
    WriteDefinedVariables(-i-1);              // -i-1
    apr(nm, "%c%d %d\t#%s\n", 'O', i,
        (int)Feeder().ObjType(i),
        Feeder().ObjDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedObjExpression(i, ew);
  }
}